

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::TextToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,size_t offset)

{
  Location loc;
  int iVar1;
  int iVar2;
  string_view text;
  undefined4 uStack_1c;
  
  iVar2 = ((int)this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar2 < 2) {
    iVar2 = 1;
  }
  iVar1 = ((int)this->cursor_ - *(int *)&this->line_start_) + 1;
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  text._M_str = this->token_start_ + offset;
  loc.field_1.field_0.first_column = iVar2;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_1c;
  loc.field_1.field_0.last_column = iVar1;
  loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
  loc.filename._M_len = (this->filename_)._M_string_length;
  text._M_len = (long)this->cursor_ - (long)text._M_str;
  Token::Token(__return_storage_ptr__,loc,token_type,text);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::TextToken(TokenType token_type, size_t offset) {
  return Token(GetLocation(), token_type, GetText(offset));
}